

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O2

void __thiscall
glcts::ViewportArray::DrawTestBase::prepareTextureArrayR32I(DrawTestBase *this,texture *texture)

{
  GLuint i;
  long lVar1;
  vector<int,_std::allocator<int>_> data;
  
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&data,0x40000);
  for (lVar1 = 0; lVar1 != 0x40000; lVar1 = lVar1 + 1) {
    data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [lVar1] = -1;
  }
  Utils::texture::create(texture,0x80,0x80,0x10,0x8235);
  Utils::texture::update
            (texture,0x80,0x80,0x10,0x8d94,0x1404,
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&data.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void DrawTestBase::prepareTextureArrayR32I(Utils::texture& texture)
{
	static const GLuint size = m_width * m_height * m_depth;

	std::vector<GLint> data;
	data.resize(size);

	for (GLuint i = 0; i < size; ++i)
	{
		data[i] = -1;
	}

	texture.create(m_width, m_height, m_depth, GL_R32I);
	texture.update(m_width, m_height, m_depth, GL_RED_INTEGER, GL_INT, &data[0]);
}